

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::GetPropertyAsBool(cmSourceFile *this,string *prop)

{
  bool bVar1;
  cmValue unaff_retaddr;
  
  GetProperty(this,prop);
  bVar1 = cmIsOn(unaff_retaddr);
  return bVar1;
}

Assistant:

bool cmSourceFile::GetPropertyAsBool(const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}